

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData *
cfd::core::Psbt::CreateRecordKey(ByteData *__return_storage_ptr__,uint8_t type,string *key)

{
  uint8_t *buffer;
  size_t sVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  buffer = (uint8_t *)(key->_M_dataplus)._M_p;
  sVar1 = strlen((char *)buffer);
  ByteData::ByteData((ByteData *)&_Stack_38,buffer,(uint32_t)sVar1);
  CreateRecordKey(__return_storage_ptr__,type,(ByteData *)&_Stack_38);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(uint8_t type, const std::string &key) {
  return CreateRecordKey(
      type, ByteData(
                reinterpret_cast<const uint8_t *>(key.data()),
                static_cast<uint32_t>(strlen(key.c_str()))));
}